

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

htab_hash_t mem_expr_hash(mem_expr_t e,void *arg)

{
  void *pvVar1;
  int iVar2;
  MIR_type_t MVar3;
  uint64_t uVar4;
  MIR_insn_t local_40;
  uint local_34;
  htab_hash_t h;
  ssa_edge_t_conflict ssa_edge;
  MIR_op_t *op_ref;
  MIR_insn_t st;
  void *arg_local;
  mem_expr_t e_local;
  
  local_40 = e->insn;
  uVar4 = mir_hash_init(0x23);
  local_34 = (uint)uVar4;
  iVar2 = move_code_p((MIR_insn_code_t)*(undefined8 *)&local_40->field_0x18);
  if (iVar2 == 0) {
    __assert_fail("move_code_p (st->code)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0xe7e,"htab_hash_t mem_expr_hash(mem_expr_t, void *)");
  }
  if ((*(ushort *)&local_40->ops[0].field_0x8 & 0xff) == 0xb) {
    local_40 = (MIR_insn_t)local_40->ops;
  }
  else {
    local_40 = local_40 + 1;
  }
  if (((ulong)(local_40->insn_link).prev & 0xff) == 0xb) {
    pvVar1 = local_40->data;
    if (pvVar1 != (void *)0x0) {
      uVar4 = mir_hash_step(uVar4 & 0xffffffff,(ulong)*(byte *)(*(long *)((long)pvVar1 + 8) + 8));
      uVar4 = mir_hash_step(uVar4 & 0xffffffff,*(uint64_t *)(*(long *)((long)pvVar1 + 8) + 0x18));
      local_34 = (uint)uVar4;
    }
    MVar3 = canonic_mem_type((uint)*(byte *)&(local_40->insn_link).next);
    uVar4 = mir_hash_step((ulong)local_34,(ulong)MVar3);
    uVar4 = mir_hash_step(uVar4 & 0xffffffff,
                          (ulong)(((anon_union_32_12_57d33f68_for_u *)&(local_40->insn_link).next)->
                                 mem).alias);
    uVar4 = mir_hash_step(uVar4 & 0xffffffff,(ulong)*(uint *)&local_40->field_0x18);
    uVar4 = mir_hash_finish(uVar4 & 0xffffffff);
    return (htab_hash_t)uVar4;
  }
  __assert_fail("op_ref->mode == MIR_OP_VAR_MEM",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0xe80,"htab_hash_t mem_expr_hash(mem_expr_t, void *)");
}

Assistant:

static htab_hash_t mem_expr_hash (mem_expr_t e, void *arg MIR_UNUSED) {
  MIR_insn_t st = e->insn;
  MIR_op_t *op_ref;
  ssa_edge_t ssa_edge;
  htab_hash_t h = (htab_hash_t) mir_hash_init (0x23);

  gen_assert (move_code_p (st->code));
  op_ref = st->ops[0].mode == MIR_OP_VAR_MEM ? &st->ops[0] : &st->ops[1];
  gen_assert (op_ref->mode == MIR_OP_VAR_MEM);
  if ((ssa_edge = op_ref->data) != NULL) {
    h = (htab_hash_t) mir_hash_step (h, (uint64_t) ssa_edge->def->gvn_val_const_p);
    h = (htab_hash_t) mir_hash_step (h, (uint64_t) ssa_edge->def->gvn_val);
  }
  h = (htab_hash_t) mir_hash_step (h, (uint64_t) canonic_mem_type (op_ref->u.var_mem.type));
  h = (htab_hash_t) mir_hash_step (h, (uint64_t) op_ref->u.var_mem.alias);
  h = (htab_hash_t) mir_hash_step (h, (uint64_t) op_ref->u.var_mem.nonalias);
  return (htab_hash_t) mir_hash_finish (h);
}